

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_viewConversion.h
# Opt level: O0

unsigned_long
gmlc::utilities::numeric_conversion<unsigned_long>(string_view V,unsigned_long defValue)

{
  string_view V_00;
  bool bVar1;
  unsigned_long in_RDX;
  invalid_argument *anon_var_0;
  size_t in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  string_view in_stack_ffffffffffffffa8;
  unsigned_long local_8;
  
  V_00._M_str = in_stack_ffffffffffffffa0;
  V_00._M_len = in_stack_ffffffffffffff98;
  bVar1 = nonNumericFirstCharacter(V_00);
  local_8 = in_RDX;
  if (!bVar1) {
    local_8 = numConv<unsigned_long>(in_stack_ffffffffffffffa8);
  }
  return local_8;
}

Assistant:

X numeric_conversion(std::string_view V, const X defValue)
{
    if (nonNumericFirstCharacter(V)) {
        return defValue;
    }
    try {
        return numConv<X>(V);
    }
    catch (const std::invalid_argument&) {
        return defValue;
    }
}